

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

void ures_swapResource(UDataSwapper *ds,Resource *inBundle,Resource *outBundle,Resource res,
                      char *key,TempTable *pTempTable,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  Resource *pRVar8;
  Resource *pRVar9;
  int iVar10;
  uint local_c4;
  uint local_b0;
  int32_t i_1;
  Resource item_1;
  Resource *r;
  int32_t *rKey32;
  uint16_t *rKey16;
  int32_t keyOffset_1;
  int32_t keyOffset;
  char *itemKey;
  uint local_78;
  int32_t oldIndex;
  int32_t i;
  Resource item;
  int32_t *qKey32;
  int32_t *pKey32;
  uint16_t *qKey16;
  uint16_t *pKey16;
  int32_t count;
  int32_t offset;
  Resource *q;
  Resource *p;
  TempTable *pTempTable_local;
  char *key_local;
  Resource res_local;
  Resource *outBundle_local;
  Resource *inBundle_local;
  UDataSwapper *ds_local;
  
  if (((2 < (res >> 0x1c) - 5) && (res >> 0x1c != 9)) && (uVar3 = res & 0xfffffff, uVar3 != 0)) {
    iVar10 = (int)uVar3 >> 5;
    if ((pTempTable->resFlags[iVar10] & 1 << ((byte)uVar3 & 0x1f)) == 0) {
      pTempTable->resFlags[iVar10] = 1 << ((byte)uVar3 & 0x1f) | pTempTable->resFlags[iVar10];
      pRVar8 = inBundle + (int)uVar3;
      pRVar9 = outBundle + (int)uVar3;
      switch(res >> 0x1c) {
      case 1:
        iVar7 = udata_readInt32_63(ds,*pRVar8);
        (*ds->swapArray32)(ds,pRVar8,4,pRVar9,pErrorCode);
        if (key != (char *)0x0) {
          if (key == "") {
            UVar1 = ucol_looksLikeCollationBinary_63(ds,pRVar8 + 1,iVar7);
            local_c4 = (uint)UVar1;
          }
          else {
            iVar4 = (*ds->compareInvChars)(ds,key,-1,L"%%CollationBin",0xe);
            local_c4 = (uint)(iVar4 == 0);
          }
          if (local_c4 != 0) {
            ucol_swap_63(ds,pRVar8 + 1,iVar7,pRVar9 + 1,pErrorCode);
          }
        }
        break;
      case 2:
      case 4:
        if (res >> 0x1c == 2) {
          uVar2 = (*ds->readUInt16)((uint16_t)*pRVar8);
          pKey16._0_4_ = (uint)uVar2;
          _i = (Resource *)0x0;
          qKey32 = (int32_t *)0x0;
          qKey16 = (uint16_t *)((long)pRVar8 + 2);
          pKey32 = (int32_t *)((long)pRVar9 + 2);
          (*ds->swapArray16)(ds,pRVar8,2,pRVar9,pErrorCode);
          uVar5 = ((uint)pKey16 + 2) / 2;
        }
        else {
          pKey16._0_4_ = udata_readInt32_63(ds,*pRVar8);
          pKey32 = (int32_t *)0x0;
          qKey16 = (uint16_t *)0x0;
          qKey32 = (int32_t *)(pRVar8 + 1);
          _i = pRVar9 + 1;
          (*ds->swapArray32)(ds,pRVar8,4,pRVar9,pErrorCode);
          uVar5 = (uint)pKey16 + 1;
        }
        pKey16._4_4_ = uVar5 + uVar3;
        if ((uint)pKey16 != 0) {
          pRVar8 = inBundle + pKey16._4_4_;
          pRVar9 = outBundle + pKey16._4_4_;
          for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
            _keyOffset_1 = "";
            if (qKey16 == (uint16_t *)0x0) {
              iVar7 = udata_readInt32_63(ds,qKey32[(int)local_78]);
              if (-1 < iVar7) {
                _keyOffset_1 = (char *)((long)outBundle + (long)iVar7);
              }
            }
            else {
              uVar2 = (*ds->readUInt16)(qKey16[(int)local_78]);
              if ((int)(uint)uVar2 < pTempTable->localKeyLimit) {
                _keyOffset_1 = (char *)((long)outBundle + (long)(int)(uint)uVar2);
              }
            }
            uVar6 = (*ds->readUInt32)(pRVar8[(int)local_78]);
            ures_swapResource(ds,inBundle,outBundle,uVar6,_keyOffset_1,pTempTable,pErrorCode);
            UVar1 = U_FAILURE(*pErrorCode);
            if (UVar1 != '\0') {
              udata_printError_63(ds,"ures_swapResource(table res=%08x)[%d].recurse(%08x) failed\n",
                                  (ulong)res,(ulong)local_78,(ulong)uVar6);
              return;
            }
          }
          if ((pTempTable->majorFormatVersion < 2) && (ds->inCharset != ds->outCharset)) {
            if (qKey16 == (uint16_t *)0x0) {
              for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
                iVar7 = udata_readInt32_63(ds,qKey32[(int)local_78]);
                pTempTable->rows[(int)local_78].keyIndex = iVar7;
                pTempTable->rows[(int)local_78].sortIndex = local_78;
              }
            }
            else {
              for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
                uVar2 = (*ds->readUInt16)(qKey16[(int)local_78]);
                pTempTable->rows[(int)local_78].keyIndex = (uint)uVar2;
                pTempTable->rows[(int)local_78].sortIndex = local_78;
              }
            }
            uprv_sortArray_63(pTempTable->rows,(uint)pKey16,8,ures_compareRows,pTempTable->keyChars,
                              '\0',pErrorCode);
            UVar1 = U_FAILURE(*pErrorCode);
            if (UVar1 == '\0') {
              if (qKey16 == (uint16_t *)0x0) {
                if ((Resource *)qKey32 == _i) {
                  r = (Resource *)pTempTable->resort;
                }
                else {
                  r = _i;
                }
                for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
                  (*ds->swapArray32)(ds,qKey32 + pTempTable->rows[(int)local_78].sortIndex,4,
                                     r + (int)local_78,pErrorCode);
                }
                if (_i != r) {
                  memcpy(_i,r,(long)(int)((uint)pKey16 << 2));
                }
              }
              else {
                if (qKey16 == (uint16_t *)pKey32) {
                  rKey32 = pTempTable->resort;
                }
                else {
                  rKey32 = pKey32;
                }
                for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
                  (*ds->swapArray16)(ds,qKey16 + pTempTable->rows[(int)local_78].sortIndex,2,
                                     (void *)((long)rKey32 + (long)(int)local_78 * 2),pErrorCode);
                }
                if (pKey32 != rKey32) {
                  memcpy(pKey32,rKey32,(long)(int)((uint)pKey16 << 1));
                }
              }
              _i_1 = pRVar9;
              if (pRVar8 == pRVar9) {
                _i_1 = (Resource *)pTempTable->resort;
              }
              for (local_78 = 0; (int)local_78 < (int)(uint)pKey16; local_78 = local_78 + 1) {
                (*ds->swapArray32)(ds,pRVar8 + pTempTable->rows[(int)local_78].sortIndex,4,
                                   _i_1 + (int)local_78,pErrorCode);
              }
              if (pRVar9 != _i_1) {
                memcpy(pRVar9,_i_1,(long)(int)((uint)pKey16 << 2));
              }
            }
            else {
              udata_printError_63(ds,
                                  "ures_swapResource(table res=%08x).uprv_sortArray(%d items) failed\n"
                                  ,(ulong)res,(ulong)(uint)pKey16);
            }
          }
          else if (qKey16 == (uint16_t *)0x0) {
            (*ds->swapArray32)(ds,qKey32,(uint)pKey16 << 3,_i,pErrorCode);
          }
          else {
            (*ds->swapArray16)(ds,qKey16,(uint)pKey16 << 1,pKey32,pErrorCode);
            (*ds->swapArray32)(ds,pRVar8,(uint)pKey16 << 2,pRVar9,pErrorCode);
          }
        }
        break;
      case 3:
      case 0:
        iVar7 = udata_readInt32_63(ds,*pRVar8);
        (*ds->swapArray32)(ds,pRVar8,4,pRVar9,pErrorCode);
        (*ds->swapArray16)(ds,pRVar8 + 1,iVar7 << 1,pRVar9 + 1,pErrorCode);
        break;
      default:
        *pErrorCode = U_UNSUPPORTED_ERROR;
        break;
      case 8:
        iVar7 = udata_readInt32_63(ds,*pRVar8);
        (*ds->swapArray32)(ds,pRVar8,4,pRVar9,pErrorCode);
        for (local_b0 = 0; (int)local_b0 < iVar7; local_b0 = local_b0 + 1) {
          uVar6 = (*ds->readUInt32)((pRVar8 + 1)[(int)local_b0]);
          ures_swapResource(ds,inBundle,outBundle,uVar6,(char *)0x0,pTempTable,pErrorCode);
          UVar1 = U_FAILURE(*pErrorCode);
          if (UVar1 != '\0') {
            udata_printError_63(ds,"ures_swapResource(array res=%08x)[%d].recurse(%08x) failed\n",
                                (ulong)res,(ulong)local_b0,(ulong)uVar6);
            return;
          }
        }
        (*ds->swapArray32)(ds,pRVar8 + 1,iVar7 << 2,pRVar9 + 1,pErrorCode);
        break;
      case 0xe:
        iVar7 = udata_readInt32_63(ds,*pRVar8);
        (*ds->swapArray32)(ds,pRVar8,(iVar7 + 1) * 4,pRVar9,pErrorCode);
      }
    }
  }
  return;
}

Assistant:

static void
ures_swapResource(const UDataSwapper *ds,
                  const Resource *inBundle, Resource *outBundle,
                  Resource res, /* caller swaps res itself */
                  const char *key,
                  TempTable *pTempTable,
                  UErrorCode *pErrorCode) {
    const Resource *p;
    Resource *q;
    int32_t offset, count;

    switch(RES_GET_TYPE(res)) {
    case URES_TABLE16:
    case URES_STRING_V2:
    case URES_INT:
    case URES_ARRAY16:
        /* integer, or points to 16-bit units, nothing to do here */
        return;
    default:
        break;
    }

    /* all other types use an offset to point to their data */
    offset=(int32_t)RES_GET_OFFSET(res);
    if(offset==0) {
        /* special offset indicating an empty item */
        return;
    }
    if(pTempTable->resFlags[offset>>5]&((uint32_t)1<<(offset&0x1f))) {
        /* we already swapped this resource item */
        return;
    } else {
        /* mark it as swapped now */
        pTempTable->resFlags[offset>>5]|=((uint32_t)1<<(offset&0x1f));
    }

    p=inBundle+offset;
    q=outBundle+offset;

    switch(RES_GET_TYPE(res)) {
    case URES_ALIAS:
        /* physically same value layout as string, fall through */
        U_FALLTHROUGH;
    case URES_STRING:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length */
        ds->swapArray32(ds, p, 4, q, pErrorCode);
        /* swap each UChar (the terminating NUL would not change) */
        ds->swapArray16(ds, p+1, 2*count, q+1, pErrorCode);
        break;
    case URES_BINARY:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length */
        ds->swapArray32(ds, p, 4, q, pErrorCode);
        /* no need to swap or copy bytes - ures_swap() copied them all */

        /* swap known formats */
#if !UCONFIG_NO_COLLATION
        if( key!=NULL &&  /* the binary is in a table */
            (key!=gUnknownKey ?
                /* its table key string is "%%CollationBin" */
                0==ds->compareInvChars(ds, key, -1,
                                       gCollationBinKey, UPRV_LENGTHOF(gCollationBinKey)-1) :
                /* its table key string is unknown but it looks like a collation binary */
                ucol_looksLikeCollationBinary(ds, p+1, count))
        ) {
            ucol_swap(ds, p+1, count, q+1, pErrorCode);
        }
#endif
        break;
    case URES_TABLE:
    case URES_TABLE32:
        {
            const uint16_t *pKey16;
            uint16_t *qKey16;

            const int32_t *pKey32;
            int32_t *qKey32;

            Resource item;
            int32_t i, oldIndex;

            if(RES_GET_TYPE(res)==URES_TABLE) {
                /* get table item count */
                pKey16=(const uint16_t *)p;
                qKey16=(uint16_t *)q;
                count=ds->readUInt16(*pKey16);

                pKey32=qKey32=NULL;

                /* swap count */
                ds->swapArray16(ds, pKey16++, 2, qKey16++, pErrorCode);

                offset+=((1+count)+1)/2;
            } else {
                /* get table item count */
                pKey32=(const int32_t *)p;
                qKey32=(int32_t *)q;
                count=udata_readInt32(ds, *pKey32);

                pKey16=qKey16=NULL;

                /* swap count */
                ds->swapArray32(ds, pKey32++, 4, qKey32++, pErrorCode);

                offset+=1+count;
            }

            if(count==0) {
                break;
            }

            p=inBundle+offset; /* pointer to table resources */
            q=outBundle+offset;

            /* recurse */
            for(i=0; i<count; ++i) {
                const char *itemKey=gUnknownKey;
                if(pKey16!=NULL) {
                    int32_t keyOffset=ds->readUInt16(pKey16[i]);
                    if(keyOffset<pTempTable->localKeyLimit) {
                        itemKey=(const char *)outBundle+keyOffset;
                    }
                } else {
                    int32_t keyOffset=udata_readInt32(ds, pKey32[i]);
                    if(keyOffset>=0) {
                        itemKey=(const char *)outBundle+keyOffset;
                    }
                }
                item=ds->readUInt32(p[i]);
                ures_swapResource(ds, inBundle, outBundle, item, itemKey, pTempTable, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "ures_swapResource(table res=%08x)[%d].recurse(%08x) failed\n",
                                     res, i, item);
                    return;
                }
            }

            if(pTempTable->majorFormatVersion>1 || ds->inCharset==ds->outCharset) {
                /* no need to sort, just swap the offset/value arrays */
                if(pKey16!=NULL) {
                    ds->swapArray16(ds, pKey16, count*2, qKey16, pErrorCode);
                    ds->swapArray32(ds, p, count*4, q, pErrorCode);
                } else {
                    /* swap key offsets and items as one array */
                    ds->swapArray32(ds, pKey32, count*2*4, qKey32, pErrorCode);
                }
                break;
            }

            /*
             * We need to sort tables by outCharset key strings because they
             * sort differently for different charset families.
             * ures_swap() already set pTempTable->keyChars appropriately.
             * First we set up a temporary table with the key indexes and
             * sorting indexes and sort that.
             * Then we permutate and copy/swap the actual values.
             */
            if(pKey16!=NULL) {
                for(i=0; i<count; ++i) {
                    pTempTable->rows[i].keyIndex=ds->readUInt16(pKey16[i]);
                    pTempTable->rows[i].sortIndex=i;
                }
            } else {
                for(i=0; i<count; ++i) {
                    pTempTable->rows[i].keyIndex=udata_readInt32(ds, pKey32[i]);
                    pTempTable->rows[i].sortIndex=i;
                }
            }
            uprv_sortArray(pTempTable->rows, count, sizeof(Row),
                           ures_compareRows, pTempTable->keyChars,
                           FALSE, pErrorCode);
            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ures_swapResource(table res=%08x).uprv_sortArray(%d items) failed\n",
                                 res, count);
                return;
            }

            /*
             * copy/swap/permutate items
             *
             * If we swap in-place, then the permutation must use another
             * temporary array (pTempTable->resort)
             * before the results are copied to the outBundle.
             */
            /* keys */
            if(pKey16!=NULL) {
                uint16_t *rKey16;

                if(pKey16!=qKey16) {
                    rKey16=qKey16;
                } else {
                    rKey16=(uint16_t *)pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray16(ds, pKey16+oldIndex, 2, rKey16+i, pErrorCode);
                }
                if(qKey16!=rKey16) {
                    uprv_memcpy(qKey16, rKey16, 2*count);
                }
            } else {
                int32_t *rKey32;

                if(pKey32!=qKey32) {
                    rKey32=qKey32;
                } else {
                    rKey32=pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray32(ds, pKey32+oldIndex, 4, rKey32+i, pErrorCode);
                }
                if(qKey32!=rKey32) {
                    uprv_memcpy(qKey32, rKey32, 4*count);
                }
            }

            /* resources */
            {
                Resource *r;


                if(p!=q) {
                    r=q;
                } else {
                    r=(Resource *)pTempTable->resort;
                }
                for(i=0; i<count; ++i) {
                    oldIndex=pTempTable->rows[i].sortIndex;
                    ds->swapArray32(ds, p+oldIndex, 4, r+i, pErrorCode);
                }
                if(q!=r) {
                    uprv_memcpy(q, r, 4*count);
                }
            }
        }
        break;
    case URES_ARRAY:
        {
            Resource item;
            int32_t i;

            count=udata_readInt32(ds, (int32_t)*p);
            /* swap length */
            ds->swapArray32(ds, p++, 4, q++, pErrorCode);

            /* recurse */
            for(i=0; i<count; ++i) {
                item=ds->readUInt32(p[i]);
                ures_swapResource(ds, inBundle, outBundle, item, NULL, pTempTable, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "ures_swapResource(array res=%08x)[%d].recurse(%08x) failed\n",
                                     res, i, item);
                    return;
                }
            }

            /* swap items */
            ds->swapArray32(ds, p, 4*count, q, pErrorCode);
        }
        break;
    case URES_INT_VECTOR:
        count=udata_readInt32(ds, (int32_t)*p);
        /* swap length and each integer */
        ds->swapArray32(ds, p, 4*(1+count), q, pErrorCode);
        break;
    default:
        /* also catches RES_BOGUS */
        *pErrorCode=U_UNSUPPORTED_ERROR;
        break;
    }
}